

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O0

void __thiscall
OpenMD::PairList::removePairs
          (PairList *this,set<int,_std::less<int>,_std::allocator<int>_> *set1,
          set<int,_std::less<int>,_std::allocator<int>_> *set2)

{
  bool bVar1;
  reference piVar2;
  undefined8 in_RDX;
  PairList *in_RSI;
  _Rb_tree_const_iterator<int> *in_RDI;
  iterator iter2;
  iterator iter1;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      piVar2 = std::_Rb_tree_const_iterator<int>::operator*(in_RDI);
      in_stack_ffffffffffffffbc = *piVar2;
      std::_Rb_tree_const_iterator<int>::operator*(in_RDI);
      removePair(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      std::_Rb_tree_const_iterator<int>::operator++(in_RDI);
    }
    std::_Rb_tree_const_iterator<int>::operator++(in_RDI);
  }
  return;
}

Assistant:

void PairList::removePairs(std::set<int>& set1, std::set<int>& set2) {
    for (std::set<int>::iterator iter1 = set1.begin(); iter1 != set1.end();
         ++iter1) {
      for (std::set<int>::iterator iter2 = set2.begin(); iter2 != set2.end();
           ++iter2) {
        this->removePair(*iter1, *iter2);
      }
    }
  }